

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O1

Promise<void> __thiscall
kj::anon_unknown_0::AsyncStreamFd::whenWriteDisconnected(AsyncStreamFd *this)

{
  long *plVar1;
  UnixEventPort *node;
  long in_RSI;
  Promise<void> result;
  ForkedPromise<void> fork;
  UnixEventPort *local_48;
  PromiseBase local_40;
  Disposer *local_38;
  char *local_30;
  char *pcStack_28;
  PromiseFulfiller<void> *local_20;
  
  if (*(char *)(in_RSI + 0x78) == '\x01') {
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)this);
  }
  else {
    UnixEventPort::FdObserver::whenWriteDisconnected((FdObserver *)&stack0xffffffffffffffb8);
    local_30 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
    ;
    pcStack_28 = "whenWriteDisconnected";
    local_20 = (PromiseFulfiller<void> *)0x13000001e0;
    Promise<void>::fork((Promise<void> *)&stack0xffffffffffffffc0);
    node = local_48;
    if (local_48 != (UnixEventPort *)0x0) {
      local_48 = (UnixEventPort *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
    }
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)&stack0xffffffffffffffb8);
    if (*(char *)(in_RSI + 0x78) == '\x01') {
      *(undefined1 *)(in_RSI + 0x78) = 0;
      plVar1 = *(long **)(in_RSI + 0x88);
      if (plVar1 != (long *)0x0) {
        *(undefined8 *)(in_RSI + 0x88) = 0;
        (**(code **)**(undefined8 **)(in_RSI + 0x80))
                  (*(undefined8 **)(in_RSI + 0x80),(long)plVar1 + *(long *)(*plVar1 + -0x10));
      }
    }
    ((OwnPromiseNode *)(in_RSI + 0x80))->ptr = (PromiseNode *)local_40.node.ptr;
    *(Disposer **)(in_RSI + 0x88) = local_38;
    *(undefined1 *)(in_RSI + 0x78) = 1;
    (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
    _vptr_AsyncInputStream = (_func_int **)local_48;
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> whenWriteDisconnected() override {
    KJ_IF_SOME(p, writeDisconnectedPromise) {
      return p.addBranch();
    } else {
      auto fork = observer.whenWriteDisconnected().fork();
      auto result = fork.addBranch();
      writeDisconnectedPromise = kj::mv(fork);
      return kj::mv(result);
    }